

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

bool __thiscall ASDCP::MXF::TLVReader::FindTL(TLVReader *this,MDDEntry *Entry)

{
  ui32_t uVar1;
  IPrimerLookup *pIVar2;
  bool bVar3;
  ILogSink *this_00;
  reference ppVar4;
  _Self local_d0;
  _Self local_c8;
  iterator e_i;
  UL local_b0;
  Result_t local_90 [110];
  TagValue local_22;
  MDDEntry *pMStack_20;
  TagValue TmpTag;
  MDDEntry *Entry_local;
  TLVReader *this_local;
  
  pMStack_20 = Entry;
  if (this->m_Lookup == (IPrimerLookup *)0x0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"No Lookup service\n");
    this_local._7_1_ = false;
  }
  else {
    pIVar2 = this->m_Lookup;
    UL::UL(&local_b0,Entry->ul);
    (*pIVar2->_vptr_IPrimerLookup[4])(local_90,pIVar2,&local_b0,&local_22);
    bVar3 = Kumu::Result_t::operator!=(local_90,(Result_t *)Kumu::RESULT_OK);
    Kumu::Result_t::~Result_t(local_90);
    UL::~UL(&local_b0);
    if (bVar3) {
      if ((pMStack_20->tag).a == '\0') {
        return false;
      }
      local_22 = pMStack_20->tag;
    }
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
         ::find(&this->m_ElementMap,&local_22);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
         ::end(&this->m_ElementMap);
    bVar3 = std::operator!=(&local_c8,&local_d0);
    if (bVar3) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator*(&local_c8);
      (this->super_MemIOReader).m_size = (ppVar4->second).first;
      uVar1 = (this->super_MemIOReader).m_size;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator*(&local_c8);
      (this->super_MemIOReader).m_capacity = uVar1 + (ppVar4->second).second;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
ASDCP::MXF::TLVReader::FindTL(const MDDEntry& Entry)
{
  if ( m_Lookup == 0 )
    {
      DefaultLogSink().Error("No Lookup service\n");
      return false;
    }
  
  TagValue TmpTag;

  if ( m_Lookup->TagForKey(Entry.ul, TmpTag) != RESULT_OK )
    {
      if ( Entry.tag.a == 0 )
	{
	  //	  DefaultLogSink().Debug("No such UL in this TL list: %s (%02x %02x)\n",
	  //				 Entry.name, Entry.tag.a, Entry.tag.b);
	  return false;
	}

      TmpTag = Entry.tag;
    }

  TagMap::iterator e_i = m_ElementMap.find(TmpTag);

  if ( e_i != m_ElementMap.end() )
    {
      m_size = (*e_i).second.first;
      m_capacity = m_size + (*e_i).second.second;
      return true;
    }

  //  DefaultLogSink().Debug("Not Found (%02x %02x): %s\n", TmpTag.a, TmpTag.b, Entry.name);
  return false;
}